

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.c
# Opt level: O1

int count_lines(FILE *fp)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  fpos_t orig_pos;
  fpos_t fStack_28;
  
  if (fp != (FILE *)0x0) {
    fgetpos((FILE *)fp,&fStack_28);
    rewind((FILE *)fp);
    iVar2 = 0;
    uVar3 = 0xfffffffe;
    do {
      iVar1 = fgetc((FILE *)fp);
      iVar2 = iVar2 + (uint)(iVar1 == 10);
      uVar3 = uVar3 + 1;
    } while (iVar1 != -1);
    fsetpos((FILE *)fp,&fStack_28);
    iVar1 = ferror((FILE *)fp);
    return -(uint)(iVar1 != 0) | iVar2 - ((int)~uVar3 >> 0x1f);
  }
  return -1;
}

Assistant:

int count_lines(FILE *fp) {
    int lines = 0;
    int ch_count = -1;
    int ch;

    fpos_t orig_pos;

    if (fp == NULL)
        return -1;

    fgetpos(fp, &orig_pos);
    rewind(fp);

    do {
        ch = fgetc(fp);
        ch_count++;
        if (ch == '\n')
            lines++;
    } while (ch != EOF);

    fsetpos(fp, &orig_pos);

    if (ch_count > 0)
        lines++;

    if (ferror(fp) != 0)
        return -1;

    return lines;
}